

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::processOtherChar(TestSpecParser *this,char c)

{
  bool bVar1;
  char in_SIL;
  TestSpecParser *in_RDI;
  
  bVar1 = isControlChar(in_RDI,in_SIL);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&in_RDI->m_substring,in_SIL);
    endMode(in_RDI);
  }
  return bVar1;
}

Assistant:

bool TestSpecParser::processOtherChar( char c ) {
        if( !isControlChar( c ) )
            return false;
        m_substring += c;
        endMode();
        return true;
    }